

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_beta_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t __n;
  uchar *puVar6;
  undefined1 auVar7 [16];
  int local_5c;
  int local_58;
  int local_54;
  int local_4c;
  int local_48;
  int local_44;
  double local_38;
  size_t l;
  int len;
  int version_local;
  char *prefix_local;
  cram_block *b_local;
  cram_codec *c_local;
  
  l._0_4_ = 0;
  if (prefix != (char *)0x0) {
    __n = strlen(prefix);
    while (b->alloc <= b->byte + __n) {
      if (b->alloc == 0) {
        local_38 = 1024.0;
      }
      else {
        sVar1 = b->alloc;
        auVar7._8_4_ = (int)(sVar1 >> 0x20);
        auVar7._0_8_ = sVar1;
        auVar7._12_4_ = 0x45300000;
        local_38 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
      }
      b->alloc = (long)local_38 | (long)(local_38 - 9.223372036854776e+18) & (long)local_38 >> 0x3f;
      puVar6 = (uchar *)realloc(b->data,b->alloc);
      b->data = puVar6;
    }
    memcpy(b->data + b->byte,prefix,__n);
    b->byte = __n + b->byte;
    l._0_4_ = (int)__n;
  }
  iVar2 = itf8_put_blk(b,c->codec);
  if (((c->field_6).e_byte_array_len.len_encoding & 0xffffff80) == E_NULL) {
    local_44 = 1;
  }
  else {
    if (((c->field_6).e_byte_array_len.len_encoding & 0xffffc000) == E_NULL) {
      local_48 = 2;
    }
    else {
      if (((c->field_6).e_byte_array_len.len_encoding & 0xffe00000) == E_NULL) {
        local_4c = 3;
      }
      else {
        local_4c = 5;
        if (((c->field_6).e_byte_array_len.len_encoding & 0xf0000000) == E_NULL) {
          local_4c = 4;
        }
      }
      local_48 = local_4c;
    }
    local_44 = local_48;
  }
  if (((c->field_6).external.type & 0xffffff80) == 0) {
    local_54 = 1;
  }
  else {
    if (((c->field_6).external.type & 0xffffc000) == 0) {
      local_58 = 2;
    }
    else {
      if (((c->field_6).external.type & 0xffe00000) == 0) {
        local_5c = 3;
      }
      else {
        local_5c = 5;
        if (((c->field_6).external.type & 0xf0000000) == 0) {
          local_5c = 4;
        }
      }
      local_58 = local_5c;
    }
    local_54 = local_58;
  }
  iVar3 = itf8_put_blk(b,local_44 + local_54);
  iVar4 = itf8_put_blk(b,(c->field_6).huffman.ncodes);
  iVar5 = itf8_put_blk(b,(c->field_6).beta.nbits);
  return iVar5 + iVar4 + iVar3 + iVar2 + (int)l;
}

Assistant:

int cram_beta_encode_store(cram_codec *c, cram_block *b,
			   char *prefix, int version) {
    int len = 0;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, itf8_size(c->e_beta.offset)
			+ itf8_size(c->e_beta.nbits)); // codec length
    len += itf8_put_blk(b, c->e_beta.offset);
    len += itf8_put_blk(b, c->e_beta.nbits);

    return len;
}